

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O2

void CopyConstantRaw(InstructionVMEvalContext *ctx,char *dst,uint dstSize,VmConstant *src,
                    uint storeSize)

{
  VmValueType VVar1;
  StackFrame *pSVar2;
  VariableData *container;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  StackFrame **ppSVar6;
  double dVar7;
  Storage *storage;
  ulong *__src;
  uint index;
  ulong local_40;
  uint local_34;
  
  ppSVar6 = SmallArray<InstructionVMEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames);
  if (dstSize < storeSize) {
    __assert_fail("dstSize >= storeSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                  ,0x15c,
                  "void CopyConstantRaw(InstructionVMEvalContext &, char *, unsigned int, VmConstant *, unsigned int)"
                 );
  }
  pSVar2 = *ppSVar6;
  VVar1 = (src->super_VmValue).type.type;
  uVar4 = (src->super_VmValue).type.size;
  if ((VVar1 == VM_TYPE_INT) && (uVar4 == 4)) {
    if (storeSize == 4) {
      *(int *)dst = src->iValue;
    }
    else if (storeSize == 2) {
      *(short *)dst = (short)src->iValue;
    }
    else {
      if (storeSize != 1) {
        __assert_fail("!\"invalid store size\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                      ,0x170,
                      "void CopyConstantRaw(InstructionVMEvalContext &, char *, unsigned int, VmConstant *, unsigned int)"
                     );
      }
      *dst = (char)src->iValue;
    }
  }
  else {
    if ((VVar1 == VM_TYPE_DOUBLE) && (uVar4 == 8)) {
      if (storeSize != 8) {
        if (storeSize == 4) {
          *(float *)dst = (float)src->dValue;
          return;
        }
        __assert_fail("!\"invalid store size\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                      ,0x180,
                      "void CopyConstantRaw(InstructionVMEvalContext &, char *, unsigned int, VmConstant *, unsigned int)"
                     );
      }
      dVar7 = src->dValue;
    }
    else {
      if ((VVar1 != VM_TYPE_LONG) || (uVar4 != 8)) {
        if (VVar1 == VM_TYPE_POINTER) {
          if (uVar4 != 8) {
            __assert_fail("src->type.size == sizeof(void*)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                          ,0x18b,
                          "void CopyConstantRaw(InstructionVMEvalContext &, char *, unsigned int, VmConstant *, unsigned int)"
                         );
          }
          container = src->container;
          if (container == (VariableData *)0x0) {
            local_40 = (ulong)src->iValue;
          }
          else {
            if (container->importModule != (ModuleData *)0x0) {
              anon_unknown.dwarf_228387::Report(ctx,"ERROR: can\'t access imported variable");
              return;
            }
            uVar4 = GetAllocaAddress(ctx,container);
            if (uVar4 == 0) {
              bVar3 = IsGlobalScope(container->scope);
              uVar4 = container->offset + src->iValue;
              if (bVar3) {
                if (0xffff < uVar4) {
                  __assert_fail("(pointer & memoryOffsetMask) == pointer",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                                ,0x1a0,
                                "void CopyConstantRaw(InstructionVMEvalContext &, char *, unsigned int, VmConstant *, unsigned int)"
                               );
                }
                storage = &ctx->globalFrame->stack;
              }
              else {
                if (0xffff < uVar4) {
                  __assert_fail("(pointer & memoryOffsetMask) == pointer",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                                ,0x1a6,
                                "void CopyConstantRaw(InstructionVMEvalContext &, char *, unsigned int, VmConstant *, unsigned int)"
                               );
                }
                storage = &pSVar2->stack;
              }
            }
            else {
              uVar4 = uVar4 + src->iValue;
              if (0xffff < uVar4) {
                __assert_fail("(pointer & memoryOffsetMask) == pointer",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                              ,0x19a,
                              "void CopyConstantRaw(InstructionVMEvalContext &, char *, unsigned int, VmConstant *, unsigned int)"
                             );
              }
              storage = &pSVar2->allocas;
            }
            uVar5 = GetStorageIndex(ctx,storage);
            local_40 = (ulong)(uVar5 << 0x10 | uVar4);
          }
          uVar4 = (src->super_VmValue).type.size;
          __src = &local_40;
        }
        else {
          if (src->sValue != (char *)0x0) {
            memcpy(dst,src->sValue,(ulong)uVar4);
            return;
          }
          if (src->fValue == (VmFunction *)0x0) {
            __assert_fail("!\"unknown constant type\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                          ,0x1bf,
                          "void CopyConstantRaw(InstructionVMEvalContext &, char *, unsigned int, VmConstant *, unsigned int)"
                         );
          }
          if (uVar4 != 4) {
            __assert_fail("src->type.size == 4",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                          ,0x1b7,
                          "void CopyConstantRaw(InstructionVMEvalContext &, char *, unsigned int, VmConstant *, unsigned int)"
                         );
          }
          local_34 = ExpressionContext::GetFunctionIndex(ctx->ctx,src->fValue->function);
          __src = (ulong *)&local_34;
          uVar4 = (src->super_VmValue).type.size;
        }
        memcpy(dst,__src,(ulong)uVar4);
        return;
      }
      dVar7 = (double)src->lValue;
    }
    *(double *)dst = dVar7;
  }
  return;
}

Assistant:

void CopyConstantRaw(InstructionVMEvalContext &ctx, char *dst, unsigned dstSize, VmConstant *src, unsigned storeSize)
{
	InstructionVMEvalContext::StackFrame *frame = ctx.stackFrames.back();

	(void)dstSize;
	assert(dstSize >= storeSize);

	if(src->type == VmType::Int)
	{
		if(storeSize == 1)
		{
			char tmp = (char)src->iValue;
			memcpy(dst, &tmp, storeSize);
		}
		else if(storeSize == 2)
		{
			short tmp = (short)src->iValue;
			memcpy(dst, &tmp, storeSize);
		}
		else if(storeSize == 4)
		{
			memcpy(dst, &src->iValue, storeSize);
		}
		else
		{
			assert(!"invalid store size");
		}
	}
	else if(src->type == VmType::Double)
	{
		if(storeSize == 4)
		{
			float tmp = (float)src->dValue;
			memcpy(dst, &tmp, storeSize);
		}
		else if(storeSize == 8)
		{
			memcpy(dst, &src->dValue, storeSize);
		}
		else
		{
			assert(!"invalid store size");
		}
	}
	else if(src->type == VmType::Long)
	{
		assert(src->type.size == 8);

		memcpy(dst, &src->lValue, src->type.size);
	}
	else if(src->type.type == VM_TYPE_POINTER)
	{
		assert(src->type.size == sizeof(void*));

		unsigned long long pointer = 0;

		if(VariableData *variable = src->container)
		{
			if(variable->importModule)
			{
				Report(ctx, "ERROR: can't access imported variable");
				return;
			}

			if(unsigned offset = GetAllocaAddress(ctx, variable))
			{
				pointer = src->iValue + offset;
				assert((pointer & memoryOffsetMask) == pointer);
				pointer |= GetStorageIndex(ctx, &frame->allocas) << memoryStorageBits;
			}
			else if(IsGlobalScope(variable->scope))
			{
				pointer = src->iValue + variable->offset;
				assert((pointer & memoryOffsetMask) == pointer);
				pointer |= GetStorageIndex(ctx, &ctx.globalFrame->stack) << memoryStorageBits;
			}
			else
			{
				pointer = src->iValue + variable->offset;
				assert((pointer & memoryOffsetMask) == pointer);
				pointer |= GetStorageIndex(ctx, &frame->stack) << memoryStorageBits;
			}
		}
		else
		{
			pointer = src->iValue;
		}

		memcpy(dst, &pointer, src->type.size);
	}
	else if(src->sValue)
	{
		memcpy(dst, src->sValue, src->type.size);
	}
	else if(src->fValue)
	{
		assert(src->type.size == 4);

		unsigned index = ctx.ctx.GetFunctionIndex(src->fValue->function);

		memcpy(dst, &index, src->type.size);
	}
	else
	{
		assert(!"unknown constant type");
	}
}